

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorMalloc_TestShell::createTest
          (TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorMalloc_TestShell *this)

{
  TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorMalloc_Test *this_00;
  
  this_00 = (TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorMalloc_Test *)
            operator_new(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
                         ,0x12a);
  TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorMalloc_Test::
  TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorMalloc_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MemoryLeakWarningGlobalDetectorTest, crashOnLeakWithOperatorMalloc)
{
    MemoryLeakWarningPlugin::setGlobalDetector(dummyDetector, dummyReporter);

    MemoryLeakWarningPlugin::restoreNewDeleteOverloads();

    crash_on_allocation_number(1);
    char* memory = (char*) cpputest_malloc(10);
    CHECK(cpputestHasCrashed);
    cpputest_free(memory);

    MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();
}